

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

int PystringSet_Convert(PyObject *py_strings,xmlChar ***result)

{
  ulong uVar1;
  xmlChar **__s;
  PyTypeObject **ppPVar2;
  xmlChar *pxVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  uint local_38;
  
  uVar1 = py_strings->ob_type->tp_flags;
  if ((uVar1 & 0x6000000) == 0) {
    if (py_strings != (PyObject *)&_Py_NoneStruct) {
      pcVar8 = "must be a tuple or list of strings.";
      uVar9 = _PyExc_TypeError;
      goto LAB_0013f472;
    }
    *result = (xmlChar **)0x0;
  }
  else {
    uVar6 = (uint)py_strings[1].ob_refcnt;
    __s = (xmlChar **)(*_xmlMalloc)((long)(int)uVar6 << 3);
    if (__s == (xmlChar **)0x0) {
      pcVar8 = "";
      uVar9 = _PyExc_MemoryError;
LAB_0013f472:
      PyErr_SetString(uVar9,pcVar8);
      return -1;
    }
    memset(__s,0,(long)(int)uVar6 << 3);
    if (0 < (int)uVar6) {
      uVar7 = (ulong)(uVar6 & 0x7fffffff);
      lVar10 = 0;
      lVar5 = 0;
      iVar11 = 0;
      do {
        local_38 = (uint)uVar1;
        uVar6 = (uint)py_strings->ob_type->tp_flags;
        if ((local_38 >> 0x1a & 1) == 0) {
          if ((uVar6 >> 0x19 & 1) == 0) {
            __assert_fail("PyList_Check(py_strings)",
                          "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                          ,0xce7,"int PystringSet_Convert(PyObject *, xmlChar ***)");
          }
          ppPVar2 = (PyTypeObject **)
                    ((long)&((py_strings[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar10);
        }
        else {
          if ((uVar6 >> 0x1a & 1) == 0) {
            __assert_fail("PyTuple_Check(py_strings)",
                          "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                          ,0xce6,"int PystringSet_Convert(PyObject *, xmlChar ***)");
          }
          ppPVar2 = &py_strings[1].ob_type + lVar5;
        }
        pxVar3 = (xmlChar *)PyBytes_AsString(*ppPVar2);
        if (pxVar3 == (xmlChar *)0x0) {
          (*_xmlFree)(__s);
          PyErr_SetString(_PyExc_TypeError,"must be a tuple or list of strings.");
          return -1;
        }
        lVar4 = (long)iVar11;
        iVar11 = iVar11 + 1;
        __s[lVar4] = pxVar3;
        lVar5 = lVar5 + 1;
        lVar10 = lVar10 + 8;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    *result = __s;
  }
  return 0;
}

Assistant:

static int
PystringSet_Convert(PyObject *py_strings, xmlChar *** result)
{
    /* NOTE: the array should be freed, but the strings are shared
       with the python strings and so must not be freed. */

    xmlChar ** strings;
    int is_tuple = 0;
    int count;
    int init_index = 0;

    if (PyTuple_Check(py_strings))
        is_tuple = 1;
    else if (PyList_Check(py_strings))
        is_tuple = 0;
    else if (py_strings == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of strings.");
        return -1;
    }

    count = (is_tuple
             ? PyTuple_GET_SIZE(py_strings)
             : PyList_GET_SIZE(py_strings));

    strings = (xmlChar **) xmlMalloc(sizeof(xmlChar *) * count);

    if (strings == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    memset(strings, 0 , sizeof(xmlChar *) * count);

    {
        int idx;
        for (idx=0; idx < count; ++idx) {
            char* s = PyBytes_AsString
                (is_tuple
                 ? PyTuple_GET_ITEM(py_strings, idx)
                 : PyList_GET_ITEM(py_strings, idx));
            if (s)
                strings[init_index++] = (xmlChar *)s;
            else {
                xmlFree(strings);
                PyErr_SetString(PyExc_TypeError,
                                "must be a tuple or list of strings.");
                return -1;
            }
        }
    }

    *result = strings;
    return 0;
}